

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFlushFinishTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::anon_unknown_0::WaitOnlyCase::init(WaitOnlyCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  int iVar1;
  EVP_PKEY_CTX *ctx_00;
  undefined1 local_190 [384];
  
  local_190._0_8_ =
       ((this->super_FlushFinishCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  this_00 = (ostringstream *)(local_190 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::ostream::operator<<(this_00,200);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ms busy wait",0xd);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  ctx_00 = (EVP_PKEY_CTX *)&std::__cxx11::ostringstream::VTT;
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x78));
  iVar1 = FlushFinishCase::init(&this->super_FlushFinishCase,ctx_00);
  return iVar1;
}

Assistant:

void init (void)
	{
		m_testCtx.getLog() << TestLog::Message << int(WAIT_TIME_MS) << " ms busy wait" << TestLog::EndMessage;
		FlushFinishCase::init();
	}